

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void append(vec *v,void *element)

{
  uint uVar1;
  void *__src;
  void *__dest;
  uint64 uVar2;
  
  uVar2 = v->size;
  if (uVar2 == v->cap) {
    v->cap = uVar2 * 2;
    uVar1 = v->element_size;
    __dest = malloc(uVar2 * 2 * (ulong)uVar1);
    __src = v->start;
    memcpy(__dest,__src,uVar2 * uVar1);
    free(__src);
    v->start = __dest;
    uVar2 = v->size;
  }
  else {
    __dest = v->start;
  }
  memcpy((void *)(uVar2 * v->element_size + (long)__dest),element,(ulong)v->element_size);
  v->size = v->size + 1;
  return;
}

Assistant:

void append(vec *v, void *element) {
    if (v->size == v->cap) {
        v->cap *= 2;
        void *new = malloc(v->cap * v->element_size);
        memcpy(new, v->start, v->size * v->element_size);
        free(v->start);
        v->start = new;
    }
    memcpy(v->start + v->size * v->element_size, element, v->element_size);
    v->size++;
}